

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

WAVE_FEATURE Diligent::VkSubgroupFeatureFlagsToWaveFeatures(VkSubgroupFeatureFlags FeatureFlags)

{
  WAVE_FEATURE WVar1;
  uint uVar2;
  
  WVar1 = WAVE_FEATURE_UNKNOWN;
  do {
    if (FeatureFlags == 0) {
      return WVar1;
    }
    uVar2 = -FeatureFlags & FeatureFlags;
    FeatureFlags = FeatureFlags ^ uVar2;
    switch(uVar2) {
    case 1:
      WVar1 = WVar1 | WAVE_FEATURE_BASIC;
      break;
    case 2:
      WVar1 = WVar1 | WAVE_FEATURE_VOTE;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      WVar1 = WVar1 | WAVE_FEATURE_ARITHMETIC;
      break;
    case 8:
      WVar1 = WVar1 | WAVE_FEATURE_BALLOUT;
      break;
    default:
      if (uVar2 == 0x10) {
        WVar1 = WVar1 | WAVE_FEATURE_SHUFFLE;
      }
      else if (uVar2 == 0x20) {
        WVar1 = WVar1 | WAVE_FEATURE_SHUFFLE_RELATIVE;
      }
      else if (uVar2 == 0x40) {
        WVar1 = WVar1 | WAVE_FEATURE_CLUSTERED;
      }
      else if (uVar2 == 0x80) {
        WVar1 = WVar1 | WAVE_FEATURE_LAST;
      }
    }
  } while( true );
}

Assistant:

WAVE_FEATURE VkSubgroupFeatureFlagsToWaveFeatures(VkSubgroupFeatureFlags FeatureFlags)
{
    WAVE_FEATURE Result = WAVE_FEATURE_UNKNOWN;
    while (FeatureFlags != 0)
    {
        VkSubgroupFeatureFlags Feature = ExtractLSB(FeatureFlags);
        static_assert(WAVE_FEATURE_LAST == WAVE_FEATURE_QUAD,
                      "Please update the switch below to handle the new wave feature");
        switch (Feature)
        {
            // clang-format off
            case VK_SUBGROUP_FEATURE_BASIC_BIT:            Result |= WAVE_FEATURE_BASIC;            break;
            case VK_SUBGROUP_FEATURE_VOTE_BIT:             Result |= WAVE_FEATURE_VOTE;             break;
            case VK_SUBGROUP_FEATURE_ARITHMETIC_BIT:       Result |= WAVE_FEATURE_ARITHMETIC;       break;
            case VK_SUBGROUP_FEATURE_BALLOT_BIT:           Result |= WAVE_FEATURE_BALLOUT;          break;
            case VK_SUBGROUP_FEATURE_SHUFFLE_BIT:          Result |= WAVE_FEATURE_SHUFFLE;          break;
            case VK_SUBGROUP_FEATURE_SHUFFLE_RELATIVE_BIT: Result |= WAVE_FEATURE_SHUFFLE_RELATIVE; break;
            case VK_SUBGROUP_FEATURE_CLUSTERED_BIT:        Result |= WAVE_FEATURE_CLUSTERED;        break;
            case VK_SUBGROUP_FEATURE_QUAD_BIT:             Result |= WAVE_FEATURE_QUAD;             break;
            // clang-format on
            default:
                // Don't handle unknown features
                break;
        }
    }
    return Result;
}